

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_byte_array_stop_decode_block
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out_,int *out_size)

{
  size_t __n;
  uchar uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  cram_block *pcVar12;
  uchar *__src;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  
  iVar7 = -1;
  if (slice->block_by_id == (cram_block **)0x0) {
    uVar2 = slice->hdr->num_blocks;
    uVar8 = 0;
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    pcVar12 = (cram_block *)0x0;
    for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      pcVar12 = slice->block[uVar8];
      if (((pcVar12 != (cram_block *)0x0) && (pcVar12->content_type == EXTERNAL)) &&
         (pcVar12->content_id == (c->field_6).external.type)) {
        uVar4 = uVar8 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar4 == uVar2) {
      return -1;
    }
    if (pcVar12 == (cram_block *)0x0) {
      return -1;
    }
  }
  else {
    pcVar12 = slice->block_by_id[(c->field_6).beta.nbits];
    if (pcVar12 == (cram_block *)0x0) {
      return -(uint)(*out_size != 0);
    }
  }
  lVar11 = (long)pcVar12->idx;
  iVar3 = pcVar12->uncomp_size;
  if (pcVar12->idx < iVar3) {
    __src = pcVar12->data + lVar11;
    pvVar5 = *(void **)(out_ + 0x20);
    uVar4 = *(ulong *)(out_ + 0x28);
    lVar6 = *(long *)(out_ + 0x30);
    uVar1 = (c->field_6).byte_array_stop.stop;
    uVar8 = iVar3 - lVar11;
    if (uVar8 < uVar4 - lVar6) {
      lVar11 = -((long)pvVar5 + lVar6);
      for (uVar4 = 0; (__src[uVar4] != uVar1 && (uVar8 != uVar4)); uVar4 = uVar4 + 1) {
        *(uchar *)((long)pvVar5 + lVar6 + uVar4) = __src[uVar4];
        lVar11 = lVar11 + -1;
      }
      *(long *)(out_ + 0x30) = -(lVar11 + *(long *)(out_ + 0x20));
      iVar7 = (int)uVar4;
    }
    else {
      sVar10 = 0xffffffffffffffff;
      do {
        __n = sVar10 + 1;
        if (__src[sVar10 + 1] == uVar1) break;
        lVar9 = sVar10 + (lVar11 - iVar3);
        sVar10 = __n;
      } while (lVar9 != -1);
      iVar7 = (int)__n;
      while (uVar4 <= __n + lVar6) {
        auVar13._8_4_ = (int)(uVar4 >> 0x20);
        auVar13._0_8_ = uVar4;
        auVar13._12_4_ = 0x45300000;
        dVar15 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) * 1.5;
        uVar8 = (ulong)dVar15;
        sVar10 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar4 == 0) {
          sVar10 = 0x400;
        }
        *(size_t *)(out_ + 0x28) = sVar10;
        pvVar5 = realloc(pvVar5,sVar10);
        *(void **)(out_ + 0x20) = pvVar5;
        lVar6 = *(long *)(out_ + 0x30);
        uVar4 = *(ulong *)(out_ + 0x28);
      }
      memcpy((void *)((long)pvVar5 + lVar6),__src,__n);
      lVar11 = *(long *)(out_ + 0x30) + __n;
      *(long *)(out_ + 0x30) = lVar11;
      while (uVar4 = *(ulong *)(out_ + 0x28), uVar4 <= lVar11 + __n) {
        auVar14._8_4_ = (int)(uVar4 >> 0x20);
        auVar14._0_8_ = uVar4;
        auVar14._12_4_ = 0x45300000;
        dVar15 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) * 1.5;
        uVar8 = (ulong)dVar15;
        sVar10 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar4 == 0) {
          sVar10 = 0x400;
        }
        *(size_t *)(out_ + 0x28) = sVar10;
        pvVar5 = realloc(*(void **)(out_ + 0x20),sVar10);
        *(void **)(out_ + 0x20) = pvVar5;
        lVar11 = *(long *)(out_ + 0x30);
      }
    }
    iVar7 = (int)__src + iVar7;
    iVar3 = *(int *)&pcVar12->data;
    *out_size = iVar7 - (pcVar12->idx + iVar3);
    pcVar12->idx = (iVar7 - iVar3) + 1;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int cram_byte_array_stop_decode_block(cram_slice *slice, cram_codec *c,
				      cram_block *in, char *out_,
				      int *out_size) {
    cram_block *b = NULL;
    cram_block *out = (cram_block *)out_;
    char *cp, *out_cp, *cp_end;
    char stop;

    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->byte_array_stop.content_id]))
	    return *out_size?-1:0;
    } else {
	int i;
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->byte_array_stop.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    if (b->idx >= b->uncomp_size)
	return -1;
    cp = (char *)b->data + b->idx;
    cp_end = (char *)b->data + b->uncomp_size;
    out_cp = (char *)BLOCK_END(out);

    stop = c->byte_array_stop.stop;
    if (cp_end - cp < out->alloc - out->byte) {
	while (*cp != stop && cp != cp_end)
	    *out_cp++ = *cp++;
	BLOCK_SIZE(out) = out_cp - (char *)BLOCK_DATA(out);
    } else {
	char *cp_start;
	for (cp_start = cp; *cp != stop && cp != cp_end; cp++)
	    ;
	BLOCK_APPEND(out, cp_start, cp - cp_start);
	BLOCK_GROW(out, cp - cp_start);
    }

    *out_size = cp - (char *)(b->data + b->idx);
    b->idx = cp - (char *)b->data + 1;

    return 0;
}